

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

void __thiscall SQTable::AllocNodes(SQTable *this,SQInteger nSize)

{
  _HashNode *this_00;
  _HashNode *p_Var1;
  long in_RSI;
  SQAllocContext in_RDI;
  _HashNode *e;
  _HashNode *i;
  _HashNode *nodes;
  SQUnsignedInteger in_stack_ffffffffffffffc8;
  
  this_00 = (_HashNode *)sq_vm_malloc(in_RDI,in_stack_ffffffffffffffc8);
  *(int *)(in_RDI + 0x48) = (int)in_RSI + -1;
  *(_HashNode **)(in_RDI + 0x40) = this_00;
  *(ulong *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x40) + (ulong)*(uint *)(in_RDI + 0x48) * 0x28;
  p_Var1 = this_00 + in_RSI;
  for (; this_00 != p_Var1; this_00 = this_00 + 1) {
    _HashNode::_HashNode(this_00);
  }
  return;
}

Assistant:

void SQTable::AllocNodes(SQInteger nSize)
{
    assert((nSize & (nSize-1)) == 0); // pow2
    _HashNode *nodes=(_HashNode *)SQ_MALLOC(_alloc_ctx, sizeof(_HashNode)*nSize);
    _numofnodes_minus_one=(uint32_t)(nSize-1);
    _nodes=nodes;
    _firstfree=&_nodes[_numofnodes_minus_one];
    for (_HashNode *i = nodes, *e = i + nSize; i != e; i++)
        new (i) _HashNode;
}